

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O0

void __thiscall DiskGen::Recalib(DiskGen *this)

{
  DiskGen *this_local;
  
  if (this->current_track_ < 0x4e) {
    this->current_track_ = 0;
  }
  else {
    this->current_track_ = this->current_track_ - 0x4d;
  }
  if ((this->disk_present_ & 1U) != 0) {
    (*this->disk_->_vptr_IDisk[10])
              (this->disk_,(ulong)(uint)this->current_side_,(ulong)this->current_track_);
    ComputeSpeed(this,0);
  }
  return;
}

Assistant:

void DiskGen::Recalib()
{
   if (current_track_ > 77)
   {
      current_track_ -= 77;
   }
   else
   {
      current_track_ = 0;
   }
   if (disk_present_)
   {
      // Get next single bit
      disk_->ChangeTrack(current_side_, current_track_);
      ComputeSpeed(0);
   }
}